

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_prepare.cpp
# Opt level: O0

void __thiscall mocker::CodegenPreparation::naiveStrengthReduction(CodegenPreparation *this)

{
  bool bVar1;
  bool bVar2;
  OpType OVar3;
  BasicBlockList *this_00;
  reference this_01;
  InstList *this_02;
  element_type *peVar4;
  shared_ptr<mocker::ir::Addr> *psVar5;
  element_type *peVar6;
  int64_t iVar7;
  uint64_t n;
  shared_ptr<mocker::ir::Reg> *__args_1;
  shared_ptr<mocker::ir::Assign> local_f8;
  shared_ptr<mocker::ir::IntLiteral> local_e8;
  undefined1 local_d4 [24];
  int local_bc;
  undefined1 local_b8 [4];
  int pos;
  shared_ptr<mocker::ir::IntLiteral> lit;
  undefined1 local_98 [8];
  shared_ptr<mocker::ir::Addr> rhs;
  undefined1 local_78 [8];
  shared_ptr<mocker::ir::Addr> lhs;
  undefined1 local_60 [8];
  shared_ptr<mocker::ir::ArithBinaryInst> binary;
  shared_ptr<mocker::ir::IRInst> *inst;
  iterator __end2;
  iterator __begin2;
  InstList *__range2;
  BasicBlock *bb;
  iterator __end1;
  iterator __begin1;
  BasicBlockList *__range1;
  CodegenPreparation *this_local;
  
  this_00 = ir::FunctionModule::getMutableBBs_abi_cxx11_((this->super_FuncPass).func);
  __end1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(this_00);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (this_00);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&bb);
    if (!bVar1) {
      return;
    }
    this_01 = std::_List_iterator<mocker::ir::BasicBlock>::operator*(&__end1);
    this_02 = ir::BasicBlock::getMutableInsts_abi_cxx11_(this_01);
    __end2 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::begin(this_02);
    inst = (shared_ptr<mocker::ir::IRInst> *)
           std::__cxx11::
           list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::end(this_02);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&inst), bVar1) {
      binary.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2);
      ir::dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>&>
                ((ir *)local_60,
                 (shared_ptr<mocker::ir::IRInst> *)
                 binary.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
      if (bVar1) {
        peVar4 = std::
                 __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_60);
        psVar5 = ir::ArithBinaryInst::getLhs(peVar4);
        std::shared_ptr<mocker::ir::Addr>::shared_ptr
                  ((shared_ptr<mocker::ir::Addr> *)local_78,psVar5);
        peVar4 = std::
                 __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_60);
        psVar5 = ir::ArithBinaryInst::getRhs(peVar4);
        std::shared_ptr<mocker::ir::Addr>::shared_ptr
                  ((shared_ptr<mocker::ir::Addr> *)local_98,psVar5);
        ir::dyc<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>&>
                  ((ir *)&lit.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,(shared_ptr<mocker::ir::Addr> *)local_78);
        bVar2 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &lit.
                            super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        bVar1 = false;
        if (bVar2) {
          peVar4 = std::
                   __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_60);
          OVar3 = ir::ArithBinaryInst::getOp(peVar4);
          bVar1 = OVar3 != Div;
        }
        std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr
                  ((shared_ptr<mocker::ir::IntLiteral> *)
                   &lit.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (bVar1) {
          std::swap<mocker::ir::Addr>
                    ((shared_ptr<mocker::ir::Addr> *)local_78,
                     (shared_ptr<mocker::ir::Addr> *)local_98);
        }
        ir::dyc<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>&>
                  ((ir *)local_b8,(shared_ptr<mocker::ir::Addr> *)local_98);
        peVar4 = std::
                 __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_60);
        OVar3 = ir::ArithBinaryInst::getOp(peVar4);
        if (OVar3 == Mul) {
LAB_001f4975:
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b8);
          if (bVar1) {
            peVar6 = std::
                     __shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_b8);
            iVar7 = ir::IntLiteral::getVal(peVar6);
            if (0 < iVar7) {
              peVar6 = std::
                       __shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_b8);
              n = ir::IntLiteral::getVal(peVar6);
              local_bc = anon_unknown_1::getNonzeroPos(n);
              if (local_bc == -1) {
                lhs.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_4_ = 5;
              }
              else {
                peVar4 = std::
                         __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_60);
                __args_1 = ir::Definition::getDest(&peVar4->super_Definition);
                peVar4 = std::
                         __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_60);
                OVar3 = ir::ArithBinaryInst::getOp(peVar4);
                local_d4._0_4_ = (OVar3 != Mul) + 3;
                std::make_shared<mocker::ir::IntLiteral,int&>((int *)&local_e8);
                std::
                make_shared<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>const&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::IntLiteral>>
                          ((shared_ptr<mocker::ir::Reg> *)(local_d4 + 4),(OpType *)__args_1,
                           (shared_ptr<mocker::ir::Addr> *)local_d4,
                           (shared_ptr<mocker::ir::IntLiteral> *)local_78);
                std::shared_ptr<mocker::ir::IRInst>::operator=
                          ((shared_ptr<mocker::ir::IRInst> *)
                           binary.
                           super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi,
                           (shared_ptr<mocker::ir::ArithBinaryInst> *)(local_d4 + 4));
                std::shared_ptr<mocker::ir::ArithBinaryInst>::~shared_ptr
                          ((shared_ptr<mocker::ir::ArithBinaryInst> *)(local_d4 + 4));
                std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr(&local_e8);
                lhs.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_4_ = 5;
              }
              goto LAB_001f4bc6;
            }
          }
          lhs.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = 5;
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_60);
          OVar3 = ir::ArithBinaryInst::getOp(peVar4);
          if (OVar3 == Div) goto LAB_001f4975;
          peVar4 = std::
                   __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_60);
          OVar3 = ir::ArithBinaryInst::getOp(peVar4);
          if ((OVar3 == Add) &&
             (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b8), bVar1)) {
            peVar6 = std::
                     __shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_b8);
            iVar7 = ir::IntLiteral::getVal(peVar6);
            if (iVar7 != 0) goto LAB_001f4bbf;
            peVar4 = std::
                     __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_60);
            psVar5 = (shared_ptr<mocker::ir::Addr> *)
                     ir::Definition::getDest(&peVar4->super_Definition);
            std::
            make_shared<mocker::ir::Assign,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Addr>&>
                      ((shared_ptr<mocker::ir::Reg> *)&local_f8,psVar5);
            std::shared_ptr<mocker::ir::IRInst>::operator=
                      ((shared_ptr<mocker::ir::IRInst> *)
                       binary.
                       super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,&local_f8);
            std::shared_ptr<mocker::ir::Assign>::~shared_ptr(&local_f8);
            lhs.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ = 5;
          }
          else {
LAB_001f4bbf:
            lhs.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ = 0;
          }
        }
LAB_001f4bc6:
        std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr
                  ((shared_ptr<mocker::ir::IntLiteral> *)local_b8);
        std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_98);
        std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_78);
      }
      else {
        lhs.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
             = 5;
      }
      std::shared_ptr<mocker::ir::ArithBinaryInst>::~shared_ptr
                ((shared_ptr<mocker::ir::ArithBinaryInst> *)local_60);
      std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2);
    }
    std::_List_iterator<mocker::ir::BasicBlock>::operator++(&__end1);
  } while( true );
}

Assistant:

void CodegenPreparation::naiveStrengthReduction() {
  for (auto &bb : func.getMutableBBs()) {
    for (auto &inst : bb.getMutableInsts()) {
      auto binary = ir::dyc<ir::ArithBinaryInst>(inst);
      if (!binary)
        continue;
      auto lhs = binary->getLhs(), rhs = binary->getRhs();
      // Associativity is required here
      if (ir::dyc<ir::IntLiteral>(lhs) &&
          binary->getOp() != ir::ArithBinaryInst::Div)
        std::swap(lhs, rhs);
      auto lit = ir::dyc<ir::IntLiteral>(rhs);

      if (binary->getOp() == ir::ArithBinaryInst::Mul ||
          binary->getOp() == ir::ArithBinaryInst::Div) {
        if (!lit || lit->getVal() <= 0)
          continue;
        auto pos = getNonzeroPos(lit->getVal());
        if (pos == -1)
          continue;
        inst = std::make_shared<ir::ArithBinaryInst>(
            binary->getDest(),
            binary->getOp() == ir::ArithBinaryInst::Mul
                ? ir::ArithBinaryInst::Shl
                : ir::ArithBinaryInst::Shr,
            lhs, std::make_shared<ir::IntLiteral>(pos));
        continue;
      }

      if (binary->getOp() == ir::ArithBinaryInst::Add && lit &&
          lit->getVal() == 0) {
        inst = std::make_shared<ir::Assign>(binary->getDest(), lhs);
        continue;
      }
    }
  }
}